

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O2

bool __thiscall
ObjectModelBuilder::buildClass(ObjectModelBuilder *this,object *classObject,bool declaration)

{
  _Rb_tree_header *p_Var1;
  pointer pvVar2;
  bool bVar3;
  Class *this_00;
  mapped_type *ppCVar4;
  ostream *poVar5;
  const_iterator cVar6;
  array *paVar7;
  string *psVar8;
  object *object;
  char *pcVar9;
  pointer pvVar10;
  bool bVar11;
  undefined1 local_b8 [8];
  string alloc;
  string name;
  undefined1 local_58 [8];
  string include;
  
  findStringInObject((string *)((long)&alloc.field_2 + 8),classObject,"name");
  if (name._M_dataplus._M_p == (pointer)0x0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"error: class ");
    pcVar9 = "";
    if (declaration) {
      pcVar9 = "declaration";
    }
    poVar5 = std::operator<<(poVar5,pcVar9);
    poVar5 = std::operator<<(poVar5," missing \'name\'");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  else {
    this_00 = (Class *)operator_new(0xe8);
    include.field_2._8_8_ = this_00;
    memset(this_00,0,0xe8);
    Class::Class(this_00);
    std::__cxx11::string::_M_assign((string *)this_00);
    ppCVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
              ::operator[](&this->m_classes,(key_type *)((long)&alloc.field_2 + 8));
    *ppCVar4 = (mapped_type)include.field_2._8_8_;
    if (declaration) {
      findStringInObject((string *)local_58,classObject,"include");
      if (include._M_dataplus._M_p == (pointer)0x0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"error: class ");
        poVar5 = std::operator<<(poVar5,"declaration");
        poVar5 = std::operator<<(poVar5," missing \'include\', name=");
        poVar5 = std::operator<<(poVar5,(string *)(alloc.field_2._M_local_buf + 8));
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::string::~string((string *)local_58);
        goto LAB_00111430;
      }
      findStringInObject((string *)local_b8,classObject,"alloc");
      if (alloc._M_dataplus._M_p == (pointer)0x0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"error: class ");
        poVar5 = std::operator<<(poVar5,"declaration");
        poVar5 = std::operator<<(poVar5," missing \'alloc\', name=");
        poVar5 = std::operator<<(poVar5,(string *)(alloc.field_2._M_local_buf + 8));
LAB_00110ef7:
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      else {
        std::__cxx11::string::_M_assign((string *)(include.field_2._8_8_ + 0x20));
        std::__cxx11::string::_M_assign((string *)(include.field_2._8_8_ + 0x40));
        *(undefined1 *)(include.field_2._8_8_ + 0xe0) = 1;
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&this->m_includes,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
        if (this->m_verbose == true) {
          poVar5 = std::operator<<((ostream *)&std::cerr,"Class (declaration): name=\'");
          poVar5 = std::operator<<(poVar5,(string *)(alloc.field_2._M_local_buf + 8));
          poVar5 = std::operator<<(poVar5,"\' include=\'");
          poVar5 = std::operator<<(poVar5,(string *)local_58);
          poVar5 = std::operator<<(poVar5,"\' alloc=\'");
          poVar5 = std::operator<<(poVar5,(string *)local_b8);
          poVar5 = std::operator<<(poVar5,"\'");
          goto LAB_00110ef7;
        }
      }
      std::__cxx11::string::~string((string *)local_b8);
      std::__cxx11::string::~string((string *)local_58);
      if (alloc._M_dataplus._M_p == (pointer)0x0) goto LAB_00111430;
    }
    else if (this->m_verbose == true) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Class: name=\'");
      poVar5 = std::operator<<(poVar5,(string *)(alloc.field_2._M_local_buf + 8));
      poVar5 = std::operator<<(poVar5,"\'");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    std::__cxx11::string::string((string *)local_58,"properties",(allocator *)local_b8);
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
            ::find(&classObject->_M_t,(key_type *)local_58);
    std::__cxx11::string::~string((string *)local_58);
    p_Var1 = &(classObject->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar6._M_node == p_Var1) {
LAB_00110fe1:
      std::__cxx11::string::string((string *)local_58,"signals",(allocator *)local_b8);
      cVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
              ::find(&classObject->_M_t,(key_type *)local_58);
      std::__cxx11::string::~string((string *)local_58);
      if ((_Rb_tree_header *)cVar6._M_node == p_Var1) {
LAB_001110dd:
        std::__cxx11::string::string((string *)local_58,"functions",(allocator *)local_b8);
        cVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                ::find(&classObject->_M_t,(key_type *)local_58);
        std::__cxx11::string::~string((string *)local_58);
        if ((_Rb_tree_header *)cVar6._M_node != p_Var1) {
          if (cVar6._M_node[2]._M_color != 3) {
            if (cVar6._M_node[2]._M_color == 4) {
              paVar7 = picojson::value::
                       get<std::vector<picojson::value,std::allocator<picojson::value>>>
                                 ((value *)(cVar6._M_node + 2));
              pvVar10 = (paVar7->
                        super__Vector_base<picojson::value,_std::allocator<picojson::value>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              pvVar2 = (paVar7->
                       super__Vector_base<picojson::value,_std::allocator<picojson::value>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
              do {
                if (pvVar10 == pvVar2) goto LAB_001111c9;
                picojson::value::value((value *)local_58,pvVar10);
                bVar3 = buildMaybeFunction(this,(value *)local_58,(Class *)include.field_2._8_8_);
                picojson::value::~value((value *)local_58);
                pvVar10 = pvVar10 + 1;
                bVar11 = false;
              } while (bVar3);
              goto LAB_00111433;
            }
            poVar5 = std::operator<<((ostream *)&std::cerr,"error: invalid function in class=");
            poVar5 = std::operator<<(poVar5,(string *)(alloc.field_2._M_local_buf + 8));
            std::endl<char,std::char_traits<char>>(poVar5);
            goto LAB_00111430;
          }
          psVar8 = picojson::value::get<std::__cxx11::string>((value *)(cVar6._M_node + 2));
          buildFunction(this,psVar8,(Class *)include.field_2._8_8_);
        }
LAB_001111c9:
        std::__cxx11::string::string((string *)local_58,"resources",(allocator *)local_b8);
        cVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                ::find(&classObject->_M_t,(key_type *)local_58);
        std::__cxx11::string::~string((string *)local_58);
        if ((_Rb_tree_header *)cVar6._M_node == p_Var1) {
LAB_001112c1:
          if (!declaration) {
            std::__cxx11::string::string((string *)local_58,"root",(allocator *)local_b8);
            cVar6 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                    ::find(&classObject->_M_t,(key_type *)local_58);
            std::__cxx11::string::~string((string *)local_58);
            if (((_Rb_tree_header *)cVar6._M_node != p_Var1) &&
               (bVar3 = buildObject(this,(value *)(cVar6._M_node + 2),(Object *)0x0,
                                    (Class *)include.field_2._8_8_), !bVar3)) goto LAB_00111430;
          }
          std::__cxx11::string::string((string *)local_58,"replicators",(allocator *)local_b8);
          cVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                  ::find(&classObject->_M_t,(key_type *)local_58);
          std::__cxx11::string::~string((string *)local_58);
          bVar11 = true;
          if ((_Rb_tree_header *)cVar6._M_node == p_Var1) goto LAB_00111433;
          if (cVar6._M_node[2]._M_color == 5) {
            object = picojson::value::
                     get<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                               ((value *)(cVar6._M_node + 2));
            bVar3 = buildReplicator(this,object,(Class *)include.field_2._8_8_);
            if (bVar3) {
LAB_00111401:
              bVar11 = true;
              goto LAB_00111433;
            }
          }
          else {
            if (cVar6._M_node[2]._M_color == 4) {
              paVar7 = picojson::value::
                       get<std::vector<picojson::value,std::allocator<picojson::value>>>
                                 ((value *)(cVar6._M_node + 2));
              pvVar10 = (paVar7->
                        super__Vector_base<picojson::value,_std::allocator<picojson::value>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              pvVar2 = (paVar7->
                       super__Vector_base<picojson::value,_std::allocator<picojson::value>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
              bVar11 = false;
              do {
                if (pvVar10 == pvVar2) goto LAB_00111401;
                picojson::value::value((value *)local_58,pvVar10);
                bVar3 = buildMaybeReplicator(this,(value *)local_58,(Class *)include.field_2._8_8_);
                picojson::value::~value((value *)local_58);
                pvVar10 = pvVar10 + 1;
              } while (bVar3);
              goto LAB_00111433;
            }
            poVar5 = std::operator<<((ostream *)&std::cerr,
                                     "error: invalid \'replicators\' in class=");
            poVar5 = std::operator<<(poVar5,(string *)(alloc.field_2._M_local_buf + 8));
            std::endl<char,std::char_traits<char>>(poVar5);
          }
        }
        else if (cVar6._M_node[2]._M_color == 3) {
          psVar8 = picojson::value::get<std::__cxx11::string>((value *)(cVar6._M_node + 2));
          bVar3 = buildResource(this,psVar8,(Class *)include.field_2._8_8_);
          if (bVar3) goto LAB_001112c1;
        }
        else {
          if (cVar6._M_node[2]._M_color == 4) {
            paVar7 = picojson::value::
                     get<std::vector<picojson::value,std::allocator<picojson::value>>>
                               ((value *)(cVar6._M_node + 2));
            pvVar10 = (paVar7->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pvVar2 = (paVar7->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)
                     ._M_impl.super__Vector_impl_data._M_finish;
            do {
              if (pvVar10 == pvVar2) goto LAB_001112c1;
              picojson::value::value((value *)local_58,pvVar10);
              bVar3 = buildMaybeResource(this,(value *)local_58,(Class *)include.field_2._8_8_);
              picojson::value::~value((value *)local_58);
              pvVar10 = pvVar10 + 1;
              bVar11 = false;
            } while (bVar3);
            goto LAB_00111433;
          }
          poVar5 = std::operator<<((ostream *)&std::cerr,"error: invalid resource in class=");
          poVar5 = std::operator<<(poVar5,(string *)(alloc.field_2._M_local_buf + 8));
          std::endl<char,std::char_traits<char>>(poVar5);
        }
      }
      else if (cVar6._M_node[2]._M_color == 3) {
        psVar8 = picojson::value::get<std::__cxx11::string>((value *)(cVar6._M_node + 2));
        bVar3 = buildSignal(this,psVar8,(Class *)include.field_2._8_8_);
        if (bVar3) goto LAB_001110dd;
      }
      else {
        if (cVar6._M_node[2]._M_color == 4) {
          paVar7 = picojson::value::
                   get<std::vector<picojson::value,std::allocator<picojson::value>>>
                             ((value *)(cVar6._M_node + 2));
          pvVar10 = (paVar7->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pvVar2 = (paVar7->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          do {
            if (pvVar10 == pvVar2) goto LAB_001110dd;
            picojson::value::value((value *)local_58,pvVar10);
            bVar3 = buildMaybeSignal(this,(value *)local_58,(Class *)include.field_2._8_8_);
            picojson::value::~value((value *)local_58);
            pvVar10 = pvVar10 + 1;
            bVar11 = false;
          } while (bVar3);
          goto LAB_00111433;
        }
        poVar5 = std::operator<<((ostream *)&std::cerr,"error: invalid signal in class=");
        poVar5 = std::operator<<(poVar5,(string *)(alloc.field_2._M_local_buf + 8));
        std::endl<char,std::char_traits<char>>(poVar5);
      }
    }
    else if (cVar6._M_node[2]._M_color == 3) {
      psVar8 = picojson::value::get<std::__cxx11::string>((value *)(cVar6._M_node + 2));
      bVar3 = buildProperty(this,psVar8,(Class *)include.field_2._8_8_);
      if (bVar3) goto LAB_00110fe1;
    }
    else if (cVar6._M_node[2]._M_color == 4) {
      paVar7 = picojson::value::get<std::vector<picojson::value,std::allocator<picojson::value>>>
                         ((value *)(cVar6._M_node + 2));
      pvVar10 = (paVar7->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pvVar2 = (paVar7->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      do {
        if (pvVar10 == pvVar2) goto LAB_00110fe1;
        picojson::value::value((value *)local_58,pvVar10);
        bVar3 = buildMaybeProperty(this,(value *)local_58,(Class *)include.field_2._8_8_);
        picojson::value::~value((value *)local_58);
        pvVar10 = pvVar10 + 1;
      } while (bVar3);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,"error: invalid property in class=");
      poVar5 = std::operator<<(poVar5,(string *)(alloc.field_2._M_local_buf + 8));
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
LAB_00111430:
  bVar11 = false;
LAB_00111433:
  std::__cxx11::string::~string((string *)(alloc.field_2._M_local_buf + 8));
  return bVar11;
}

Assistant:

bool ObjectModelBuilder::buildClass(const picojson::object &classObject, bool declaration)
{
    // Class *clazz = new Class();
    std::string name = findStringInObject(classObject, "name");
    if (name.empty()) {
        std::cerr << "error: class " << (declaration ? "declaration" : "") << " missing 'name'" << std::endl;
        return false;
    }

    Class *clazz = new Class();
    clazz->name = name;
    m_classes[name] = clazz;

    if (declaration) {
        std::string include = findStringInObject(classObject, "include");
        if (include.empty()) {
            std::cerr << "error: class " << (declaration ? "declaration" : "") << " missing 'include', name=" << name << std::endl;
            return false;
        }
        std::string alloc = findStringInObject(classObject, "alloc");
        if (alloc.empty()) {
            std::cerr << "error: class " << (declaration ? "declaration" : "") << " missing 'alloc', name=" << name << std::endl;
            return false;
        }
        clazz->include = include;
        clazz->alloc = alloc;
        clazz->declarationOnly = true;

        m_includes.insert(include);
        if (m_verbose)
            std::cerr << "Class (declaration): name='" << name << "' include='" << include << "' alloc='" << alloc << "'" << std::endl;
    } else {
        if (m_verbose)
            std::cerr << "Class: name='" << name << "'" << std::endl;
    }


    auto propertyIt = classObject.find("properties");
    if (propertyIt != classObject.end()) {
        const picojson::value &props = propertyIt->second;
        if (props.is<picojson::array>()) {
            for (auto prop : props.get<picojson::array>()) {
                if (!buildMaybeProperty(prop, clazz))
                    return false;
            }
        } else if (props.is<std::string>()) {
            if (!buildProperty(props.get<std::string>(), clazz))
                return false;
        } else {
            std::cerr << "error: invalid property in class=" << name << std::endl;
            return false;
        }
    }

    auto signalIt = classObject.find("signals");
    if (signalIt != classObject.end()) {
        const picojson::value &signals = signalIt->second;
        if (signals.is<picojson::array>()) {
            for (auto signal : signals.get<picojson::array>())
                if (!buildMaybeSignal(signal, clazz))
                    return false;
        } else if (signals.is<std::string>()) {
            if (!buildSignal(signals.get<std::string>(), clazz))
                return false;
        } else {
            std::cerr << "error: invalid signal in class=" << name << std::endl;
            return false;
        }
    }

    auto functionsIt = classObject.find("functions");
    if (functionsIt != classObject.end()) {
        const picojson::value &functions = functionsIt->second;
        if (functions.is<picojson::array>()) {
            for (auto function : functions.get<picojson::array>())
                if (!buildMaybeFunction(function, clazz))
                    return false;
        } else if (functions.is<std::string>()) {
            if (!buildFunction(functions.get<std::string>(), clazz))
                return false;
        } else {
            std::cerr << "error: invalid function in class=" << name << std::endl;
            return false;
        }
    }

    auto resourcesIt = classObject.find("resources");
    if (resourcesIt != classObject.end()) {
        const picojson::value &resources = resourcesIt->second;
        if (resources.is<picojson::array>()) {
            for (auto resource : resources.get<picojson::array>())
                if (!buildMaybeResource(resource, clazz))
                    return false;
        } else if (resources.is<std::string>()) {
            if (!buildResource(resources.get<std::string>(), clazz))
                return false;
        } else {
            std::cerr << "error: invalid resource in class=" << name << std::endl;
            return false;
        }
    }

    if (!declaration) {
        auto rootIt = classObject.find("root");
        if (rootIt != classObject.end()) {
            const picojson::value &root = rootIt->second;
            if (!buildObject(root, 0, clazz))
                return false;
        }

    }

    auto replicatorsIt = classObject.find("replicators");
    if (replicatorsIt != classObject.end()) {
        const picojson::value &replicators = replicatorsIt->second;
        if (replicators.is<picojson::array>()) {
            for (auto replicator : replicators.get<picojson::array>())
                if (!buildMaybeReplicator(replicator, clazz))
                    return false;
        } else if (replicators.is<picojson::object>()) {
            if (!buildReplicator(replicators.get<picojson::object>(), clazz))
                return false;
        } else {
            std::cerr << "error: invalid 'replicators' in class=" << name << std::endl;
            return false;
        }
    }

    return true;
}